

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O1

char * NewtJoinPath(char *s1,char *s2,char sep)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  
  sVar1 = strlen(s1);
  sVar2 = strlen(s2);
  __dest = (char *)malloc((ulong)((int)sVar2 + (int)sVar1 + 2));
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    strcpy(__dest,s1);
    __dest[sVar1 & 0xffffffff] = sep;
    strncpy(__dest + (sVar1 & 0xffffffff) + 1,s2,(ulong)((int)sVar2 + 1));
  }
  return __dest;
}

Assistant:

char * NewtJoinPath(char * s1, char * s2, char sep)
{
    char *		path;
    uint32_t	len;
    uint32_t	len1;
    uint32_t	len2;
    
    len1 = (uint32_t)strlen(s1);
    len2 = (uint32_t)strlen(s2);
    
    len = len1 + len2 + 2;
    
    path = malloc(len);
    if (path == NULL) return NULL;
    
    strcpy(path, s1);
    
    path[len1] = sep;
    strncpy(path + len1 + 1, s2, len2 + 1);
    
    return path;
}